

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

Frame * __thiscall rw::Frame::removeChild(Frame *this)

{
  void *pvVar1;
  Frame *pFVar2;
  Frame **ppFVar3;
  Frame *pFVar4;
  
  pvVar1 = (this->object).parent;
  pFVar2 = *(Frame **)((long)pvVar1 + 0xb0);
  if (pFVar2 == this) {
    ppFVar3 = (Frame **)((long)pvVar1 + 0xb0);
  }
  else {
    do {
      pFVar4 = pFVar2;
      pFVar2 = pFVar4->next;
    } while (pFVar2 != this);
    ppFVar3 = &pFVar4->next;
  }
  *ppFVar3 = this->next;
  this->next = (Frame *)0x0;
  (this->object).parent = (void *)0x0;
  setHierarchyRoot(this,this);
  updateObjects(this);
  return this;
}

Assistant:

Frame*
Frame::removeChild(void)
{
	Frame *parent = this->getParent();
	Frame *child = parent->child;
	if(child == this)
		parent->child = this->next;
	else{
		while(child->next != this)
			child = child->next;
		child->next = this->next;
	}
	this->object.parent = this->next = nil;
	// give the hierarchy a new root
	this->setHierarchyRoot(this);
	this->updateObjects();
	return this;
}